

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::OP_LdHomeObjProto(Var homeObj,ScriptContext *scriptContext)

{
  bool bVar1;
  ThreadContext *pTVar2;
  RecyclableObject *pRVar3;
  
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  if ((ulong)homeObj >> 0x30 == 0 && homeObj != (Var)0x0) {
    pRVar3 = VarTo<Js::RecyclableObject>(homeObj);
    if (((pRVar3->type).ptr)->typeId < TypeIds_Boolean) {
      JavascriptError::ThrowReferenceError(scriptContext,-0x7ff5ebe7,(PCWSTR)0x0);
    }
    pRVar3 = RecyclableObject::GetPrototype(pRVar3);
    if (pRVar3 != (RecyclableObject *)0x0) goto LAB_00acbcd7;
  }
  pRVar3 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
           super_JavascriptLibraryBase).undefinedValue.ptr;
LAB_00acbcd7:
  pTVar2->noJsReentrancy = bVar1;
  return pRVar3;
}

Assistant:

Var JavascriptOperators::OP_LdHomeObjProto(Var homeObj, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(LdHomeObjProto, reentrancylock, scriptContext->GetThreadContext());
        if (homeObj == nullptr || !VarIs<RecyclableObject>(homeObj))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        RecyclableObject *thisObjPrototype = VarTo<RecyclableObject>(homeObj);

        TypeId typeId = thisObjPrototype->GetTypeId();

        if (typeId == TypeIds_Null || typeId == TypeIds_Undefined)
        {
            JavascriptError::ThrowReferenceError(scriptContext, JSERR_BadSuperReference);
        }

        Assert(thisObjPrototype != nullptr);

        RecyclableObject *superBase = thisObjPrototype->GetPrototype();

        if (superBase == nullptr || !VarIsCorrectType(superBase))
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }

        return superBase;
        JIT_HELPER_END(LdHomeObjProto);
    }